

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O2

bool_t decIsValid(char *dec)

{
  char cVar1;
  bool_t bVar2;
  
  bVar2 = strIsValid(dec);
  if (bVar2 != 0) {
    do {
      cVar1 = *dec;
      if (cVar1 == '\0') {
        return 1;
      }
      dec = dec + 1;
    } while (0xf5 < (byte)(cVar1 - 0x3aU));
  }
  return 0;
}

Assistant:

bool_t decIsValid(const char* dec)
{
	if (!strIsValid(dec))
		return FALSE;
	for (; *dec; ++dec)
		if (*dec < '0' || *dec > '9')
			return FALSE;
	return TRUE;
}